

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int MemHashInit(unqlite_kv_engine *pKvEngine,int iPageSize)

{
  SyMemBackend *pParent;
  unqlite_kv_io *puVar1;
  mem_hash_kv_engine *pEngine;
  int iPageSize_local;
  unqlite_kv_engine *pKvEngine_local;
  
  pParent = unqliteExportMemBackend();
  SyMemBackendInitFromParent((SyMemBackend *)(pKvEngine + 1),pParent);
  pKvEngine[0x18].pIo = (unqlite_kv_io *)MemHashFunc;
  pKvEngine[0x19].pIo = (unqlite_kv_io *)SyMemcmp;
  puVar1 = (unqlite_kv_io *)SyMemBackendAlloc((SyMemBackend *)(pKvEngine + 1),0x200);
  pKvEngine[0x1b].pIo = puVar1;
  if (pKvEngine[0x1b].pIo == (unqlite_kv_io *)0x0) {
    pKvEngine_local._4_4_ = -1;
  }
  else {
    SyZero(pKvEngine[0x1b].pIo,0x200);
    *(undefined4 *)&pKvEngine[0x1a].pIo = 0;
    *(undefined4 *)((long)&pKvEngine[0x1a].pIo + 4) = 0x40;
    pKvEngine_local._4_4_ = 0;
  }
  return pKvEngine_local._4_4_;
}

Assistant:

static int MemHashInit(unqlite_kv_engine *pKvEngine,int iPageSize)
{
	mem_hash_kv_engine *pEngine = (mem_hash_kv_engine *)pKvEngine;
	/* Note that this instance is already zeroed */	
	/* Memory backend */
	SyMemBackendInitFromParent(&pEngine->sAlloc,unqliteExportMemBackend());
//#if defined(UNQLITE_ENABLE_THREADS)
//	/* Already protected by the upper layers */
//	SyMemBackendDisbaleMutexing(&pEngine->sAlloc);
//#endif
	/* Default hash & comparison function */
	pEngine->xHash = MemHashFunc;
	pEngine->xCmp = SyMemcmp;
	/* Allocate a new bucket */
	pEngine->apBucket = (mem_hash_record **)SyMemBackendAlloc(&pEngine->sAlloc,MEM_HASH_BUCKET_SIZE * sizeof(mem_hash_record *));
	if( pEngine->apBucket == 0 ){
		SXUNUSED(iPageSize); /* cc warning */
		return UNQLITE_NOMEM;
	}
	/* Zero the bucket */
	SyZero(pEngine->apBucket,MEM_HASH_BUCKET_SIZE * sizeof(mem_hash_record *));
	pEngine->nRecord = 0;
	pEngine->nBucket = MEM_HASH_BUCKET_SIZE;
	return UNQLITE_OK;
}